

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCommandArgumentParserHelper.cxx
# Opt level: O0

char * __thiscall
cmCommandArgumentParserHelper::ExpandVariable(cmCommandArgumentParserHelper *this,char *var)

{
  cmMakefile *pcVar1;
  string_view str;
  bool bVar2;
  int iVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *b;
  string *psVar4;
  string local_130;
  allocator<char> local_109;
  string local_108;
  allocator<char> local_e1;
  string local_e0;
  cmValue local_c0;
  cmValue value;
  string_view local_98;
  string local_88;
  cmListFileContext *local_68;
  cmListFileContext *top;
  undefined1 local_50 [8];
  cmListFileBacktrace bt;
  string line;
  char *var_local;
  cmCommandArgumentParserHelper *this_local;
  
  if (var == (char *)0x0) {
    this_local = (cmCommandArgumentParserHelper *)0x0;
  }
  else if ((this->FileLine < 0) || (iVar3 = strcmp(var,"CMAKE_CURRENT_LIST_LINE"), iVar3 != 0)) {
    pcVar1 = this->Makefile;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_e0,var,&local_e1);
    local_c0 = cmMakefile::GetDefinition(pcVar1,&local_e0);
    std::__cxx11::string::~string((string *)&local_e0);
    std::allocator<char>::~allocator(&local_e1);
    bVar2 = cmValue::operator_cast_to_bool(&local_c0);
    if (!bVar2) {
      pcVar1 = this->Makefile;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_108,var,&local_109);
      cmMakefile::MaybeWarnUninitialized(pcVar1,&local_108,this->FileName);
      std::__cxx11::string::~string((string *)&local_108);
      std::allocator<char>::~allocator(&local_109);
      if ((this->RemoveEmpty & 1U) == 0) {
        return (char *)(cmCommandArgumentParserHelper *)0x0;
      }
    }
    if (((this->EscapeQuotes & 1U) == 0) ||
       (bVar2 = cmValue::operator_cast_to_bool(&local_c0), !bVar2)) {
      psVar4 = cmValue::operator_cast_to_string_(&local_c0);
      this_local = (cmCommandArgumentParserHelper *)AddString(this,psVar4);
    }
    else {
      psVar4 = cmValue::operator*[abi_cxx11_(&local_c0);
      str = (string_view)std::__cxx11::string::operator_cast_to_basic_string_view((string *)psVar4);
      cmEscapeQuotes_abi_cxx11_(&local_130,str);
      this_local = (cmCommandArgumentParserHelper *)AddString(this,&local_130);
      std::__cxx11::string::~string((string *)&local_130);
    }
  }
  else {
    std::__cxx11::string::string
              ((string *)
               &bt.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
                super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount);
    cmMakefile::GetBacktrace((cmMakefile *)local_50);
    local_68 = cmConstStack<cmListFileContext,_cmListFileBacktrace>::Top
                         ((cmConstStack<cmListFileContext,_cmListFileBacktrace> *)local_50);
    bVar2 = std::optional::operator_cast_to_bool((optional *)&local_68->DeferId);
    if (bVar2) {
      local_98 = (string_view)::cm::operator____s("DEFERRED:",9);
      b = std::
          optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator*(&local_68->DeferId);
      cmStrCat<cm::static_string_view,std::__cxx11::string_const&>
                (&local_88,(static_string_view *)&local_98,b);
      std::__cxx11::string::operator=
                ((string *)
                 &bt.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
                  super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount,(string *)&local_88);
      std::__cxx11::string::~string((string *)&local_88);
    }
    else {
      std::__cxx11::to_string((string *)&value,this->FileLine);
      std::__cxx11::string::operator=
                ((string *)
                 &bt.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
                  super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount,(string *)&value);
      std::__cxx11::string::~string((string *)&value);
    }
    this_local = (cmCommandArgumentParserHelper *)
                 AddString(this,(string *)
                                &bt.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
                                 TopEntry.
                                 super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_refcount);
    cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)local_50);
    std::__cxx11::string::~string
              ((string *)
               &bt.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
                super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount);
  }
  return (char *)this_local;
}

Assistant:

const char* cmCommandArgumentParserHelper::ExpandVariable(const char* var)
{
  if (!var) {
    return nullptr;
  }
  if (this->FileLine >= 0 && strcmp(var, "CMAKE_CURRENT_LIST_LINE") == 0) {
    std::string line;
    cmListFileBacktrace bt = this->Makefile->GetBacktrace();
    cmListFileContext const& top = bt.Top();
    if (top.DeferId) {
      line = cmStrCat("DEFERRED:"_s, *top.DeferId);
    } else {
      line = std::to_string(this->FileLine);
    }
    return this->AddString(line);
  }
  cmValue value = this->Makefile->GetDefinition(var);
  if (!value) {
    this->Makefile->MaybeWarnUninitialized(var, this->FileName);
    if (!this->RemoveEmpty) {
      return nullptr;
    }
  }
  if (this->EscapeQuotes && value) {
    return this->AddString(cmEscapeQuotes(*value));
  }
  return this->AddString(value);
}